

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<Fad<long_double>_>::PrepareZ
          (TPZMatrix<Fad<long_double>_> *this,TPZFMatrix<Fad<long_double>_> *y,
          TPZFMatrix<Fad<long_double>_> *z,Fad<long_double> *beta,int opt)

{
  longdouble lVar1;
  longdouble lVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  Fad<long_double> *pFVar8;
  longdouble *plVar9;
  long lVar10;
  longdouble *plVar11;
  ulong uVar12;
  size_t sVar13;
  long lVar14;
  Vector<long_double> *this_00;
  ulong uVar15;
  long local_b8;
  long local_90;
  Fad<long_double> local_68;
  
  lVar5 = (&(this->super_TPZBaseMatrix).fRow)[opt != 0];
  lVar6 = (y->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol;
  (*(z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xd])(z,lVar5,lVar6);
  if (0 < lVar6) {
    local_90 = 0;
    local_b8 = 0;
    do {
      lVar7 = (z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow;
      if ((lVar7 < 1) ||
         ((z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol <= local_b8)) {
        TPZFMatrix<Fad<long_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
        ;
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pFVar8 = z->fElem;
      local_68.dx_.num_elts = 0;
      local_68.dx_.ptr_to_data = (longdouble *)0x0;
      local_68.defaultVal._0_8_ = 0;
      local_68.defaultVal._8_2_ = 0;
      lVar1 = beta->val_;
      local_68.val_ = (longdouble)0;
      Fad<long_double>::~Fad(&local_68);
      if ((lVar1 != (longdouble)0) || (NAN(lVar1) || NAN((longdouble)0))) {
        if (z != y) {
          memcpy(pFVar8 + lVar7 * local_b8,
                 y->fElem +
                 (y->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow * local_b8,
                 lVar5 * 0x30);
        }
        if (0 < lVar5) {
          lVar7 = (z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow;
          lVar14 = 0;
          do {
            if ((lVar7 <= lVar14) ||
               ((z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol <= local_b8)) {
              TPZFMatrix<Fad<long_double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar10 = lVar7 * local_b8;
            pFVar8 = z->fElem + lVar10 + lVar14;
            uVar3 = (beta->dx_).num_elts;
            uVar4 = z->fElem[lVar10 + lVar14].dx_.num_elts;
            uVar15 = (ulong)uVar4;
            lVar1 = beta->val_;
            if ((ulong)uVar3 == 0) {
              if ((uVar15 != 0) && (0 < (int)uVar4)) {
                plVar9 = (pFVar8->dx_).ptr_to_data;
                lVar10 = 0;
                do {
                  *(longdouble *)((long)plVar9 + lVar10) =
                       *(longdouble *)((long)plVar9 + lVar10) * lVar1;
                  lVar10 = lVar10 + 0x10;
                } while (uVar15 << 4 != lVar10);
              }
            }
            else {
              plVar9 = (beta->dx_).ptr_to_data;
              if (uVar15 == 0) {
                (pFVar8->dx_).num_elts = uVar3;
                uVar12 = (ulong)uVar3 << 4;
                uVar15 = uVar12;
                if ((int)uVar3 < 0) {
                  uVar15 = 0xffffffffffffffff;
                }
                plVar11 = (longdouble *)operator_new__(uVar15);
                (pFVar8->dx_).ptr_to_data = plVar11;
                if (0 < (int)uVar3) {
                  lVar2 = pFVar8->val_;
                  uVar15 = 0;
                  do {
                    *(longdouble *)((long)plVar11 + uVar15) =
                         *(longdouble *)((long)plVar9 + uVar15) * lVar2;
                    uVar15 = uVar15 + 0x10;
                  } while (uVar12 != uVar15);
                }
              }
              else if (0 < (int)uVar4) {
                plVar11 = (pFVar8->dx_).ptr_to_data;
                lVar10 = 0;
                do {
                  *(longdouble *)((long)plVar11 + lVar10) =
                       *(longdouble *)((long)plVar11 + lVar10) * lVar1 +
                       *(longdouble *)((long)plVar9 + lVar10) * pFVar8->val_;
                  lVar10 = lVar10 + 0x10;
                } while (uVar15 << 4 != lVar10);
              }
            }
            pFVar8->val_ = pFVar8->val_ * lVar1;
            lVar14 = lVar14 + 1;
          } while (lVar14 != lVar5);
        }
      }
      else if (lVar5 != 0) {
        this_00 = (Vector<long_double> *)((long)&(pFVar8->dx_).num_elts + lVar7 * local_90);
        sVar13 = lVar5 * 0x30;
        do {
          *(longdouble *)(this_00 + -1) = (longdouble)0;
          if (this_00->num_elts != 0) {
            local_68.val_ = (longdouble)0;
            Vector<long_double>::operator=(this_00,&local_68.val_);
          }
          this_00 = this_00 + 3;
          sVar13 = sVar13 - 0x30;
        } while (sVar13 != 0);
      }
      local_b8 = local_b8 + 1;
      local_90 = local_90 + 0x30;
    } while (local_b8 != lVar6);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}